

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.cpp
# Opt level: O1

bool wasm::TableUtils::usesExpressions(ElementSegment *curr,Module *module)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  long lVar4;
  
  ppEVar2 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)ppEVar1 - (long)ppEVar2 >> 5;
  ppEVar3 = ppEVar2;
  if (0 < lVar4) {
    ppEVar3 = (pointer)(((long)ppEVar1 - (long)ppEVar2 & 0xffffffffffffffe0U) + (long)ppEVar2);
    lVar4 = lVar4 + 1;
    ppEVar2 = ppEVar2 + 2;
    do {
      if (ppEVar2[-2]->_id != RefFuncId) {
        ppEVar2 = ppEVar2 + -2;
        goto LAB_00739002;
      }
      if (ppEVar2[-1]->_id != RefFuncId) {
        ppEVar2 = ppEVar2 + -1;
        goto LAB_00739002;
      }
      if ((*ppEVar2)->_id != RefFuncId) goto LAB_00739002;
      if (ppEVar2[1]->_id != RefFuncId) {
        ppEVar2 = ppEVar2 + 1;
        goto LAB_00739002;
      }
      lVar4 = lVar4 + -1;
      ppEVar2 = ppEVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)ppEVar1 - (long)ppEVar3 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      ppEVar2 = ppEVar1;
      if ((lVar4 != 3) || (ppEVar2 = ppEVar3, (*ppEVar3)->_id != RefFuncId)) goto LAB_00739002;
      ppEVar3 = ppEVar3 + 1;
    }
    ppEVar2 = ppEVar3;
    if ((*ppEVar3)->_id != RefFuncId) goto LAB_00739002;
    ppEVar3 = ppEVar3 + 1;
  }
  ppEVar2 = ppEVar3;
  if ((*ppEVar3)->_id == RefFuncId) {
    ppEVar2 = ppEVar1;
  }
LAB_00739002:
  return (curr->type).id != 0x12 || ppEVar2 != ppEVar1;
}

Assistant:

bool usesExpressions(ElementSegment* curr, Module* module) {
  // Binaryen IR always has ref.funcs for functions in tables for uniformity,
  // so that by itself does not indicate if expressions should be used when
  // emitting the table or not. But definitely anything that is not a ref.func
  // implies we are post-MVP and must use expressions.
  bool allElementsRefFunc =
    std::all_of(curr->data.begin(), curr->data.end(), [](Expression* entry) {
      return entry->is<RefFunc>();
    });

  // If the segment has a specialized (non-MVP) type, then it must use the
  // post-MVP form of using expressions.
  bool hasSpecializedType = curr->type != Type(HeapType::func, Nullable);

  return !allElementsRefFunc || hasSpecializedType;
}